

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmPFlush<(moira::Instr)179,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  byte bVar1;
  u32 *this_00;
  bool bVar2;
  StrWriter *pSVar3;
  Ea<(moira::Mode)8,_2> local_5c;
  Imu<4> local_44 [2];
  Fc local_3c;
  int local_38;
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  u32 local_2c;
  u8 fc;
  u8 mask;
  u8 mode;
  u8 reg;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  _fc = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 7;
  local_2e = (byte)(local_2c >> 10) & 7;
  bVar1 = (byte)(local_2c >> 5);
  local_2f = bVar1 & 0xf;
  local_30 = (byte)local_2c & 0x1f;
  if ((**(int **)(addr_local + 0xc) == 0) || (**(int **)(addr_local + 0xc) == 1)) {
    local_2f = bVar1 & 7;
  }
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar2 = isValidExtMMU(this,PFLUSH,AL,ext._2_2_,local_2c), bVar2)) {
    pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
    local_38 = addr_local[0xe];
    StrWriter::operator<<(pSVar3,(Tab)local_38);
    this_00 = addr_local;
    Fc::Fc(&local_3c,(uint)local_30);
    pSVar3 = StrWriter::operator<<((StrWriter *)this_00,local_3c);
    pSVar3 = StrWriter::operator<<(pSVar3);
    Imu<4>::Imu(local_44,(uint)local_2f);
    StrWriter::operator<<(pSVar3,local_44[0]);
    if (local_2e == 6) {
      pSVar3 = StrWriter::operator<<((StrWriter *)addr_local);
      Op<(moira::Mode)8,2>(&local_5c,this,(ushort)local_2d,_old);
      StrWriter::operator<<(pSVar3,&local_5c);
    }
  }
  else {
    *_old = _fc;
    dasmIllegal<(moira::Instr)179,(moira::Mode)8,4>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmPFlush(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto mode = ___xxx__________ (ext);
    auto mask = _______xxxx_____ (ext);
    auto fc   = ___________xxxxx (ext);

    // Only the MC68851 has four mask bits. The 68030 only has three.
    if (str.style.syntax == Syntax::MOIRA || str.style.syntax == Syntax::MOIRA_MIT) mask &= 0b111;

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;
    str << Fc{fc} << Sep{} << Imu{mask};
    if (mode == 0b110) str << Sep{} << Op<M>(reg, addr);
}